

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id3.c
# Opt level: O1

uint id3_fill_tframe(uchar *buf,uint len,char *type,uchar encoding,char *string)

{
  size_t sVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  unsigned_long res_1;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  
  if (buf == (uchar *)0x0) {
    __assert_fail("buf != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/id3.c",0x47,
                  "unsigned int id3_fill_tframe(unsigned char *, unsigned int, char *, unsigned char, char *)"
                 );
  }
  if (len == 0) {
    __assert_fail("len > 0","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/id3.c",
                  0x48,
                  "unsigned int id3_fill_tframe(unsigned char *, unsigned int, char *, unsigned char, char *)"
                 );
  }
  if (type == (char *)0x0) {
    __assert_fail("type != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/id3.c",0x49,
                  "unsigned int id3_fill_tframe(unsigned char *, unsigned int, char *, unsigned char, char *)"
                 );
  }
  if (string != (char *)0x0) {
    sVar1 = strlen(string);
    uVar7 = (int)sVar1 + 8;
    uVar2 = 0;
    if (uVar7 <= len) {
      uVar4 = (ulong)((int)sVar1 + 2);
      buf[2] = type[2];
      *(undefined2 *)buf = *(undefined2 *)type;
      lVar3 = 0;
      uVar5 = 0;
      uVar6 = uVar4;
      do {
        uVar5 = uVar5 | (ulong)((uint)uVar6 & 0x7f) << ((byte)lVar3 & 0x3f);
        uVar6 = uVar6 >> 7;
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x20);
      buf[3] = (uchar)(uVar5 >> 0x10);
      lVar3 = 0;
      uVar5 = 0;
      uVar6 = uVar4;
      do {
        uVar5 = uVar5 | (ulong)((uint)uVar6 & 0x7f) << ((byte)lVar3 & 0x3f);
        uVar6 = uVar6 >> 7;
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x20);
      buf[4] = (uchar)(uVar5 >> 8);
      lVar3 = 0;
      uVar6 = 0;
      do {
        uVar6 = uVar6 | (ulong)((uint)uVar4 & 0x7f) << ((byte)lVar3 & 0x3f);
        uVar4 = uVar4 >> 7;
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x20);
      buf[5] = (uchar)uVar6;
      buf[6] = encoding;
      memcpy(buf + 7,string,sVar1 & 0xffffffff);
      buf[(sVar1 & 0xffffffff) + 7] = '\0';
      uVar2 = uVar7;
    }
    return uVar2;
  }
  __assert_fail("string != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/id3.c",0x4a,
                "unsigned int id3_fill_tframe(unsigned char *, unsigned int, char *, unsigned char, char *)"
               );
}

Assistant:

unsigned int id3_fill_tframe(unsigned char *buf, unsigned int len,
                             char *type,
                             unsigned char encoding,
                             char *string) {
  assert(buf != NULL);
  assert(len > 0);
  assert(type != NULL);
  assert(string != NULL);

  unsigned char *ptr = buf;
  unsigned int slen = strlen(string);
  unsigned int flen = slen + 2;
  if (len < 6 + flen)
    return 0;
  memcpy(ptr, type, 3); ptr += 3;
  UINT24_PACK(ptr, id3_sync_safe(flen));
  UINT8_PACK(ptr, encoding);
  memcpy(ptr, string, slen); ptr += slen;
  UINT8_PACK(ptr, 0x00);

  return flen + 6;
}